

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall Fossilize::ZipDatabase::prepare(ZipDatabase *this)

{
  bool bVar1;
  mz_bool mVar2;
  mz_uint mVar3;
  LogLevel LVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
  *blob;
  unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
  *__end4;
  unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
  *__begin4;
  unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
  (*__range4) [10];
  Entry local_6e8;
  ulonglong local_6d8;
  uint64_t value;
  char acStack_6c8 [4];
  uint tag;
  char value_str [17];
  char local_6a8 [8];
  char tag_str [17];
  mz_zip_archive_file_stat s;
  size_t len;
  char local_228 [4];
  uint i;
  char filename [512];
  uint files;
  ZipDatabase *this_local;
  
  if (this->mode != OverWrite) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    mVar2 = mz_zip_reader_init_file(&this->mz,pcVar5,0);
    if (mVar2 != 0) {
      mVar3 = mz_zip_reader_get_num_files(&this->mz);
      memset(local_228,0,0x200);
      for (len._4_4_ = 0; len._4_4_ < mVar3; len._4_4_ = len._4_4_ + 1) {
        bVar1 = std::atomic<bool>::load((atomic<bool> *)&shutdown_requested,memory_order_relaxed);
        if (bVar1) {
          return false;
        }
        mVar2 = mz_zip_reader_is_file_a_directory(&this->mz,len._4_4_);
        if (mVar2 == 0) {
          mz_zip_reader_get_filename(&this->mz,len._4_4_,local_228,0x200);
          sVar6 = strlen(local_228);
          if (((sVar6 == 0x28) && (bVar1 = string_is_hex(local_228), bVar1)) &&
             (mVar2 = mz_zip_reader_file_stat
                                (&this->mz,len._4_4_,(mz_zip_archive_file_stat *)(tag_str + 0x10)),
             mVar2 != 0)) {
            memset(local_6a8,0,0x11);
            memset(acStack_6c8,0,0x11);
            local_6a8[0] = filename[0];
            local_6a8[1] = filename[1];
            local_6a8[2] = filename[2];
            local_6a8[3] = filename[3];
            local_6a8[4] = filename[4];
            local_6a8[5] = filename[5];
            local_6a8[6] = filename[6];
            local_6a8[7] = filename[7];
            tag_str[0] = filename[8];
            tag_str[1] = filename[9];
            tag_str[2] = filename[10];
            tag_str[3] = filename[0xb];
            tag_str[4] = filename[0xc];
            tag_str[5] = filename[0xd];
            tag_str[6] = filename[0xe];
            tag_str[7] = filename[0xf];
            acStack_6c8[0] = filename[0x10];
            acStack_6c8[1] = filename[0x11];
            acStack_6c8[2] = filename[0x12];
            acStack_6c8[3] = filename[0x13];
            tag._0_1_ = filename[0x14];
            tag._1_1_ = filename[0x15];
            tag._2_1_ = filename[0x16];
            tag._3_1_ = filename[0x17];
            value_str[0] = filename[0x18];
            value_str[1] = filename[0x19];
            value_str[2] = filename[0x1a];
            value_str[3] = filename[0x1b];
            value_str[4] = filename[0x1c];
            value_str[5] = filename[0x1d];
            value_str[6] = filename[0x1e];
            value_str[7] = filename[0x1f];
            uVar7 = strtoul(local_6a8,(char **)0x0,0x10);
            value._4_4_ = (ResourceTag)uVar7;
            if (value._4_4_ < RESOURCE_COUNT) {
              local_6d8 = strtoull(acStack_6c8,(char **)0x0,0x10);
              bVar1 = DatabaseInterface::test_resource_filter
                                (&this->super_DatabaseInterface,value._4_4_,local_6d8);
              if (bVar1) {
                local_6e8.index = len._4_4_;
                std::
                unordered_map<unsigned_long,Fossilize::ZipDatabase::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>>
                ::emplace<unsigned_long&,Fossilize::ZipDatabase::Entry>
                          ((unordered_map<unsigned_long,Fossilize::ZipDatabase::Entry,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>>
                            *)(this->seen_blobs + value._4_4_),&local_6d8,&local_6e8);
              }
            }
          }
        }
      }
      pcVar5 = (char *)std::__cxx11::string::c_str();
      mVar2 = mz_zip_writer_init_from_reader(&this->mz,pcVar5);
      if (mVar2 != 0) {
        this->alive = true;
        return true;
      }
      LVar4 = get_thread_log_level();
      if (((int)LVar4 < 3) &&
         (bVar1 = Internal::log_thread_callback
                            (LOG_ERROR,"Failed to initialize ZIP writer from reader.\n"), !bVar1)) {
        fprintf(_stderr,"Fossilize ERROR: Failed to initialize ZIP writer from reader.\n");
      }
      mz_zip_end(&this->mz);
      return false;
    }
  }
  if (this->mode != ReadOnly) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    mVar2 = mz_zip_writer_init_file(&this->mz,pcVar5,0);
    if (mVar2 == 0) {
      LVar4 = get_thread_log_level();
      if (((int)LVar4 < 3) &&
         (bVar1 = Internal::log_thread_callback
                            (LOG_ERROR,
                             "Failed to open ZIP archive for writing. Cannot serialize anything to disk.\n"
                            ), !bVar1)) {
        fprintf(_stderr,
                "Fossilize ERROR: Failed to open ZIP archive for writing. Cannot serialize anything to disk.\n"
               );
      }
      return false;
    }
    this->alive = true;
    for (__end4 = this->seen_blobs;
        __end4 != (unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
                   *)&this->mode; __end4 = __end4 + 1) {
      std::
      unordered_map<unsigned_long,_Fossilize::ZipDatabase::Entry,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>_>
      ::clear(__end4);
    }
  }
  return true;
}

Assistant:

bool prepare() override
	{
		if (mode != DatabaseMode::OverWrite && mz_zip_reader_init_file(&mz, path.c_str(), 0))
		{
			// We have an existing archive.
			unsigned files = mz_zip_reader_get_num_files(&mz);
			char filename[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE] = {};

			for (unsigned i = 0; i < files; i++)
			{
				if (shutdown_requested.load(std::memory_order_relaxed))
					return false;

				if (mz_zip_reader_is_file_a_directory(&mz, i))
					continue;

				mz_zip_reader_get_filename(&mz, i, filename, sizeof(filename));
				size_t len = strlen(filename);
				if (len != FOSSILIZE_BLOB_HASH_LENGTH)
					continue;

				if (!string_is_hex(filename))
					continue;

				mz_zip_archive_file_stat s;
				if (!mz_zip_reader_file_stat(&mz, i, &s))
					continue;

				char tag_str[16 + 1] = {};
				char value_str[16 + 1] = {};
				memcpy(tag_str, filename + FOSSILIZE_BLOB_HASH_LENGTH - 32, 16);
				memcpy(value_str, filename + FOSSILIZE_BLOB_HASH_LENGTH - 16, 16);

				auto tag = unsigned(strtoul(tag_str, nullptr, 16));
				if (tag >= RESOURCE_COUNT)
					continue;
				uint64_t value = strtoull(value_str, nullptr, 16);

				if (test_resource_filter(static_cast<ResourceTag>(tag), value))
					seen_blobs[tag].emplace(value, Entry{i, size_t(s.m_uncomp_size)});
			}

			// In-place update the archive. Should we consider emitting a new archive instead?
			if (!mz_zip_writer_init_from_reader(&mz, path.c_str()))
			{
				LOGE_LEVEL("Failed to initialize ZIP writer from reader.\n");
				mz_zip_end(&mz);
				return false;
			}

			alive = true;
		}
		else if (mode != DatabaseMode::ReadOnly)
		{
			if (!mz_zip_writer_init_file(&mz, path.c_str(), 0))
			{
				LOGE_LEVEL("Failed to open ZIP archive for writing. Cannot serialize anything to disk.\n");
				return false;
			}

			alive = true;

			for (auto &blob : seen_blobs)
				blob.clear();
		}

		return true;
	}